

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfMapNamedBufferRange(ErrorsTest *this)

{
  ostringstream *this_00;
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  void *pvVar7;
  undefined4 *puVar8;
  byte bVar9;
  GLuint not_a_buffer_name;
  GLuint GVar10;
  ulong uVar11;
  GLuint i_1;
  GLuint i;
  long lVar12;
  GLuint buffer;
  GLuint buffer_special_flags;
  GLubyte dummy_data [4];
  GLuint local_1c4;
  GLuint local_1c0;
  byte local_1bc;
  byte local_1bb;
  byte local_1ba;
  byte local_1b9;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var_00,iVar4);
  local_1c4 = 0;
  local_1c0 = 0;
  local_1b4 = 0;
  (**(code **)(lVar6 + 0x3b8))(1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1026);
  (*this->m_pNamedBufferStorage)(local_1c4,4,&local_1b4,0x43);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x102a);
  GVar10 = 0;
  do {
    GVar10 = GVar10 + 1;
    cVar1 = (**(code **)(lVar6 + 0xc68))(GVar10);
  } while (cVar1 != '\0');
  (*this->m_pMapNamedBufferRange)(GVar10,0,4,1);
  bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                           " if buffer is not the name of an existing buffer object.");
  uVar11 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
  pvVar7 = (*this->m_pMapNamedBufferRange)(local_1c4,-1,4,1);
  bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x501," if offset is negative.");
  local_1b8 = CONCAT31(local_1b8._1_3_,bVar2);
  if (pvVar7 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)(local_1c4);
    do {
      iVar4 = (**(code **)(lVar6 + 0x800))();
    } while (iVar4 != 0);
  }
  pvVar7 = (*this->m_pMapNamedBufferRange)(local_1c4,0,-1,1);
  local_1b9 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x501," if length is negative.");
  if (pvVar7 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)(local_1c4);
    do {
      iVar4 = (**(code **)(lVar6 + 0x800))();
    } while (iVar4 != 0);
  }
  pvVar7 = (*this->m_pMapNamedBufferRange)(local_1c4,0,8,1);
  local_1ba = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x501,
                               " if length is greater than the value of BUFFER_SIZE for the buffer object, or if access has any bits set other than those defined above."
                              );
  if (pvVar7 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)(local_1c4);
    do {
      iVar4 = (**(code **)(lVar6 + 0x800))();
    } while (iVar4 != 0);
  }
  pvVar7 = (*this->m_pMapNamedBufferRange)(local_1c4,2,4,1);
  local_1bb = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x501,
                               " if offset+length is greater than the value of BUFFER_SIZE for the buffer object, or if access has any bits set other than those defined above."
                              );
  if (pvVar7 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)(local_1c4);
    do {
      iVar4 = (**(code **)(lVar6 + 0x800))();
    } while (iVar4 != 0);
  }
  pvVar7 = (*this->m_pMapNamedBufferRange)(local_1c4,0,0,1);
  local_1bc = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502," if length is zero.");
  if (pvVar7 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)(local_1c4);
    do {
      iVar4 = (**(code **)(lVar6 + 0x800))();
    } while (iVar4 != 0);
  }
  (*this->m_pMapNamedBufferRange)(local_1c4,0,4,1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glMapNamedBuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1090);
  pvVar7 = (*this->m_pMapNamedBufferRange)(local_1c4,0,4,1);
  bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                           " if the buffer object is in a mapped state.");
  (*this->m_pUnmapNamedBuffer)(local_1c4);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1099);
  if (pvVar7 == (void *)0x0) {
    pvVar7 = (*this->m_pMapNamedBufferRange)(local_1c4,0,4,0);
    bVar3 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                             " if neither MAP_READ_BIT nor MAP_WRITE_BIT is set.");
    if (pvVar7 != (void *)0x0) {
      (*this->m_pUnmapNamedBuffer)(local_1c4);
      do {
        iVar4 = (**(code **)(lVar6 + 0x800))();
      } while (iVar4 != 0);
    }
    bVar9 = (byte)uVar11 & (byte)local_1b8 & local_1b9 & local_1ba & local_1bb & local_1bc & bVar2 &
            bVar3;
    lVar12 = 0;
    do {
      pvVar7 = (*this->m_pMapNamedBufferRange)(local_1c4,0,4,(&DAT_01ac20e8)[lVar12] | 1);
      bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                               (GLchar *)((long)&DAT_01ac20f4 + (long)(int)(&DAT_01ac20f4)[lVar12]))
      ;
      if (pvVar7 != (void *)0x0) {
        (*this->m_pUnmapNamedBuffer)(local_1c4);
        do {
          iVar4 = (**(code **)(lVar6 + 0x800))();
        } while (iVar4 != 0);
      }
      bVar9 = bVar9 & bVar2;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    pvVar7 = (*this->m_pMapNamedBufferRange)(local_1c4,0,4,0x11);
    bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                             " if MAP_FLUSH_EXPLICIT_BIT is set and MAP_WRITE_BIT is not set.");
    if (pvVar7 != (void *)0x0) {
      (*this->m_pUnmapNamedBuffer)(local_1c4);
      do {
        iVar4 = (**(code **)(lVar6 + 0x800))();
      } while (iVar4 != 0);
    }
    local_1b8 = (undefined4)CONCAT71((int7)(uVar11 >> 8),bVar9 & bVar2);
    lVar12 = 0;
    do {
      (**(code **)(lVar6 + 0x3b8))(1,&local_1c0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glCreateBuffers failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x10f9);
      (*this->m_pNamedBufferStorage)(local_1c0,4,&local_1b4,(&DAT_01abf050)[lVar12]);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glNamedBuffeStorage failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x10fc);
      pvVar7 = (*this->m_pMapNamedBufferRange)(local_1c0,0,4,(&DAT_01abf060)[lVar12]);
      bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                               (GLchar *)((long)&DAT_01ac2100 + (long)(int)(&DAT_01ac2100)[lVar12]))
      ;
      if (pvVar7 != (void *)0x0) {
        (*this->m_pUnmapNamedBuffer)(local_1c4);
        do {
          iVar4 = (**(code **)(lVar6 + 0x800))();
        } while (iVar4 != 0);
      }
      if (local_1c0 != 0) {
        (**(code **)(lVar6 + 0x438))(1,&local_1c0);
        local_1c0 = 0;
      }
      bVar2 = (bool)((byte)local_1b8 & bVar2);
      local_1b8 = CONCAT31((int3)((uint)local_1b8 >> 8),bVar2);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    if (local_1c4 != 0) {
      (**(code **)(lVar6 + 0x438))(1,&local_1c4);
      local_1c4 = 0;
    }
    if (local_1c0 != 0) {
      (**(code **)(lVar6 + 0x438))(1,&local_1c0);
    }
    return bVar2;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "glMapNamedBufferRange called on mapped buffer returned non-NULL pointer when error shall occure.This may lead to undefined behavior during next tests (object still may be mapped). Test was terminated prematurely."
             ,0xd4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  puVar8 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar8 = 0;
  __cxa_throw(puVar8,&int::typeinfo,0);
}

Assistant:

bool ErrorsTest::TestErrorsOfMapNamedBufferRange()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer				  = 0;
	glw::GLuint  buffer_special_flags = 0;
	glw::GLubyte dummy_data[4]		  = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data,
							  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pMapNamedBufferRange(not_a_buffer_name, 0, sizeof(dummy_data), GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test negative offset error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, -1, sizeof(dummy_data), GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_VALUE, " if offset is negative.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test negative length error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, -1, GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_VALUE, " if length is negative.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test length overflow error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data) * 2, GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_VALUE,
									  " if length is greater than the value of BUFFER_SIZE"
									  " for the buffer object, or if access has any bits set other"
									  " than those defined above.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test (offset+length) overflow error behavior. */
		{
			glw::GLvoid* mapped_data =
				m_pMapNamedBufferRange(buffer, sizeof(dummy_data) / 2, sizeof(dummy_data), GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_VALUE,
									  " if offset+length is greater than the value of BUFFER_SIZE"
									  " for the buffer object, or if access has any bits set other"
									  " than those defined above.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test zero length error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, 0, GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION, " if length is zero.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test mapping of mapped buffer error behavior. */
		{
			m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer.");

			glw::GLvoid* subsequent_mapped_data =
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION,
									  " if the buffer object is in a mapped state.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			if (subsequent_mapped_data)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glMapNamedBufferRange called on mapped buffer returned non-NULL pointer when error shall "
					   "occure."
					   "This may lead to undefined behavior during next tests (object still may be mapped). "
					   "Test was terminated prematurely."
					<< tcu::TestLog::EndMessage;
				throw 0;
			}
		}

		/* Test access flag read and write bits are not set error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), 0);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION,
									  " if neither MAP_READ_BIT nor MAP_WRITE_BIT is set.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test read access invalid flags error behavior. */
		{
			glw::GLenum read_access_invalid_flags[] = { GL_MAP_INVALIDATE_RANGE_BIT, GL_MAP_INVALIDATE_BUFFER_BIT,
														GL_MAP_UNSYNCHRONIZED_BIT };
			const glw::GLchar* read_access_invalid_flags_log[] = {
				" if MAP_READ_BIT is set with MAP_INVALIDATE_RANGE_BIT.",
				" if MAP_READ_BIT is set with MAP_INVALIDATE_BUFFER_BIT.",
				" if MAP_READ_BIT is set with MAP_UNSYNCHRONIZED_BIT."
			};
			glw::GLuint read_access_invalid_flags_count =
				sizeof(read_access_invalid_flags) / sizeof(read_access_invalid_flags[0]);

			for (glw::GLuint i = 0; i < read_access_invalid_flags_count; ++i)
			{
				glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data),
																  GL_MAP_READ_BIT | read_access_invalid_flags[i]);

				is_ok &=
					ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION, read_access_invalid_flags_log[i]);

				/* Sanity unmapping. */
				if (DE_NULL != mapped_data)
				{
					m_pUnmapNamedBuffer(buffer);
					while (gl.getError())
						;
				}
			}
		}

		/* Test access flush bit without write bit error behavior. */
		{
			glw::GLvoid* mapped_data =
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION,
									  " if MAP_FLUSH_EXPLICIT_BIT is set and MAP_WRITE_BIT is not set.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test incompatible buffer flag error behavior. */
		{
			glw::GLenum buffer_flags[] = { GL_MAP_WRITE_BIT, GL_MAP_READ_BIT, GL_MAP_WRITE_BIT,
										   GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT };
			glw::GLenum mapping_flags[] = { GL_MAP_READ_BIT, GL_MAP_WRITE_BIT, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT,
											GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT };
			const glw::GLchar* mapping_flags_log[] = {
				" if MAP_READ_BIT is set, but the same bit is not included in the buffer's storage flags.",
				" if MAP_WRITE_BIT is set, but the same bit is not included in the buffer's storage flags.",
				" if MAP_PERSISTENT_BIT is set, but the same bit is not included in the buffer's storage flags.",
				" if MAP_COHERENT_BIT is set, but the same bit is not included in the buffer's storage flags."
			};
			glw::GLuint flags_count = sizeof(mapping_flags) / sizeof(mapping_flags[0]);

			for (glw::GLuint i = 0; i < flags_count; ++i)
			{
				/* Create buffer. */
				gl.createBuffers(1, &buffer_special_flags);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

				m_pNamedBufferStorage(buffer_special_flags, sizeof(dummy_data), &dummy_data, buffer_flags[i]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

				/* Test mapping. */
				glw::GLvoid* mapped_data =
					m_pMapNamedBufferRange(buffer_special_flags, 0, sizeof(dummy_data), mapping_flags[i]);

				is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION, mapping_flags_log[i]);

				/* Sanity unmapping. */
				if (DE_NULL != mapped_data)
				{
					m_pUnmapNamedBuffer(buffer);
					while (gl.getError())
						;
				}

				/* Releasing buffer. */
				if (buffer_special_flags)
				{
					gl.deleteBuffers(1, &buffer_special_flags);

					buffer_special_flags = 0;
				}
			}
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (buffer_special_flags)
	{
		gl.deleteBuffers(1, &buffer_special_flags);

		buffer_special_flags = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}